

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O1

real fasttext::distL2(real *x,real *y,int32_t d)

{
  ulong uVar1;
  float fVar2;
  
  if (0 < d) {
    fVar2 = 0.0;
    uVar1 = 0;
    do {
      fVar2 = fVar2 + (x[uVar1] - y[uVar1]) * (x[uVar1] - y[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)d != uVar1);
    return fVar2;
  }
  return 0.0;
}

Assistant:

real distL2(const real* x, const real* y, int32_t d) {
  real dist = 0;
  for (auto i = 0; i < d; i++) {
    auto tmp = x[i] - y[i];
    dist += tmp * tmp;
  }
  return dist;
}